

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decimal128.c
# Opt level: O1

void test_decimal128_from_string__large(void)

{
  char *suite;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bson_decimal128_t full_house;
  bson_decimal128_t tiniest;
  bson_decimal128_t largest;
  bson_decimal128_t all_digits;
  bson_decimal128_t large;
  char cStack_118;
  char cStack_117;
  char cStack_116;
  char cStack_115;
  char cStack_114;
  char cStack_113;
  char cStack_112;
  char cStack_111;
  char cStack_110;
  char cStack_10f;
  char cStack_10e;
  char cStack_10d;
  char cStack_10c;
  char cStack_10b;
  char cStack_10a;
  char cStack_109;
  char cStack_108;
  char cStack_107;
  char cStack_106;
  char cStack_105;
  char cStack_104;
  char cStack_103;
  char cStack_102;
  char cStack_101;
  char cStack_100;
  char cStack_ff;
  char cStack_fe;
  char cStack_fd;
  char cStack_fc;
  char cStack_fb;
  char cStack_fa;
  char cStack_f9;
  char cStack_f8;
  char cStack_f7;
  char cStack_f6;
  char cStack_f5;
  char cStack_f4;
  char cStack_f3;
  char cStack_f2;
  char cStack_f1;
  char cStack_f0;
  char cStack_ef;
  char cStack_ee;
  char cStack_ed;
  char cStack_ec;
  char cStack_eb;
  char cStack_ea;
  char cStack_e9;
  char cStack_e8;
  char cStack_e7;
  char cStack_e6;
  char cStack_e5;
  char cStack_e4;
  char cStack_e3;
  char cStack_e2;
  char cStack_e1;
  char cStack_e0;
  char cStack_df;
  char cStack_de;
  char cStack_dd;
  char cStack_dc;
  char cStack_db;
  char cStack_da;
  char cStack_d9;
  code *pcStack_d8;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  char cStack_b8;
  char cStack_b7;
  char cStack_b6;
  char cStack_b5;
  char cStack_b4;
  char cStack_b3;
  char cStack_b2;
  char cStack_b1;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  char cStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  char cStack_a9;
  char cStack_a8;
  char cStack_a7;
  char cStack_a6;
  char cStack_a5;
  char cStack_a4;
  char cStack_a3;
  char cStack_a2;
  char cStack_a1;
  char cStack_a0;
  char cStack_9f;
  char cStack_9e;
  char cStack_9d;
  char cStack_9c;
  char cStack_9b;
  char cStack_9a;
  char cStack_99;
  char cStack_98;
  char cStack_97;
  char cStack_96;
  char cStack_95;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  char cStack_91;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  char cStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  char cStack_89;
  char cStack_88;
  char cStack_87;
  char cStack_86;
  char cStack_85;
  char cStack_84;
  char cStack_83;
  char cStack_82;
  char cStack_81;
  char cStack_80;
  char cStack_7f;
  char cStack_7e;
  char cStack_7d;
  char cStack_7c;
  char cStack_7b;
  char cStack_7a;
  char cStack_79;
  char *pcStack_78;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  char local_38;
  char cStack_37;
  char cStack_36;
  char cStack_35;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  char cStack_30;
  char cStack_2f;
  char cStack_2e;
  char cStack_2d;
  char cStack_2c;
  char cStack_2b;
  char cStack_2a;
  char cStack_29;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char cStack_19;
  char local_18;
  char cStack_17;
  char cStack_16;
  char cStack_15;
  char cStack_14;
  char cStack_13;
  char cStack_12;
  char cStack_11;
  char cStack_10;
  char cStack_f;
  char cStack_e;
  char cStack_d;
  char cStack_c;
  char cStack_b;
  char cStack_a;
  char cStack_9;
  
  bson_decimal128_from_string("12345689012345789012345",&local_18);
  bson_decimal128_from_string("1234567890123456789012345678901234",&local_28);
  bson_decimal128_from_string("9.999999999999999999999999999999999E+6144",&local_38);
  bson_decimal128_from_string("9.999999999999999999999999999999999E-6143",&local_48);
  bson_decimal128_from_string("5.192296858534827628530496329220095E+33",&local_58);
  auVar1[0] = -(local_18 == 'y');
  auVar1[1] = -(cStack_17 == -0x27);
  auVar1[2] = -(cStack_16 == -0x20);
  auVar1[3] = -(cStack_15 == -7);
  auVar1[4] = -(cStack_14 == 'v');
  auVar1[5] = -(cStack_13 == ':');
  auVar1[6] = -(cStack_12 == -0x26);
  auVar1[7] = -(cStack_11 == 'B');
  auVar1[8] = -(cStack_10 == -99);
  auVar1[9] = -(cStack_f == '\x02');
  auVar1[10] = -(cStack_e == '\0');
  auVar1[0xb] = -(cStack_d == '\0');
  auVar1[0xc] = -(cStack_c == '\0');
  auVar1[0xd] = -(cStack_b == '\0');
  auVar1[0xe] = -(cStack_a == '@');
  auVar1[0xf] = -(cStack_9 == '0');
  if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(auVar1[0xf] >> 7) << 0xf) ==
      0xffff) {
    auVar2[0] = -(local_28 == -0xe);
    auVar2[1] = -(cStack_27 == -0x51);
    auVar2[2] = -(cStack_26 == -0x6a);
    auVar2[3] = -(cStack_25 == '~');
    auVar2[4] = -(cStack_24 == -0x30);
    auVar2[5] = -(cStack_23 == '\\');
    auVar2[6] = -(cStack_22 == -0x7e);
    auVar2[7] = -(cStack_21 == -0x22);
    auVar2[8] = -(cStack_20 == '2');
    auVar2[9] = -(cStack_1f == -0x69);
    auVar2[10] = -(cStack_1e == -1);
    auVar2[0xb] = -(cStack_1d == 'o');
    auVar2[0xc] = -(cStack_1c == -0x22);
    auVar2[0xd] = -(cStack_1b == '<');
    auVar2[0xe] = -(cStack_1a == '@');
    auVar2[0xf] = -(cStack_19 == '0');
    if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe | (ushort)(auVar2[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_00128d2e;
    auVar3[0] = -(local_38 == -1);
    auVar3[1] = -(cStack_37 == -1);
    auVar3[2] = -(cStack_36 == -1);
    auVar3[3] = -(cStack_35 == -1);
    auVar3[4] = -(cStack_34 == 'c');
    auVar3[5] = -(cStack_33 == -0x72);
    auVar3[6] = -(cStack_32 == -0x73);
    auVar3[7] = -(cStack_31 == '7');
    auVar3[8] = -(cStack_30 == -0x40);
    auVar3[9] = -(cStack_2f == -0x79);
    auVar3[10] = -(cStack_2e == -0x53);
    auVar3[0xb] = -(cStack_2d == -0x42);
    auVar3[0xc] = -(cStack_2c == '\t');
    auVar3[0xd] = -(cStack_2b == -0x13);
    auVar3[0xe] = -(cStack_2a == -1);
    auVar3[0xf] = -(cStack_29 == '_');
    if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe | (ushort)(auVar3[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_00128d33;
    auVar4[0] = -(local_48 == -1);
    auVar4[1] = -(cStack_47 == -1);
    auVar4[2] = -(cStack_46 == -1);
    auVar4[3] = -(cStack_45 == -1);
    auVar4[4] = -(cStack_44 == 'c');
    auVar4[5] = -(cStack_43 == -0x72);
    auVar4[6] = -(cStack_42 == -0x73);
    auVar4[7] = -(cStack_41 == '7');
    auVar4[8] = -(cStack_40 == -0x40);
    auVar4[9] = -(cStack_3f == -0x79);
    auVar4[10] = -(cStack_3e == -0x53);
    auVar4[0xb] = -(cStack_3d == -0x42);
    auVar4[0xc] = -(cStack_3c == '\t');
    auVar4[0xd] = -(cStack_3b == -0x13);
    auVar4[0xe] = -(cStack_3a == '\x01');
    auVar4[0xf] = -(cStack_39 == '\0');
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe | (ushort)(auVar4[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_00128d38;
    auVar5[0] = -(local_58 == -1);
    auVar5[1] = -(cStack_57 == -1);
    auVar5[2] = -(cStack_56 == -1);
    auVar5[3] = -(cStack_55 == -1);
    auVar5[4] = -(cStack_54 == -1);
    auVar5[5] = -(cStack_53 == -1);
    auVar5[6] = -(cStack_52 == -1);
    auVar5[7] = -(cStack_51 == -1);
    auVar5[8] = -(cStack_50 == -1);
    auVar5[9] = -(cStack_4f == -1);
    auVar5[10] = -(cStack_4e == -1);
    auVar5[0xb] = -(cStack_4d == -1);
    auVar5[0xc] = -(cStack_4c == -1);
    auVar5[0xd] = -(cStack_4b == -1);
    auVar5[0xe] = -(cStack_4a == '@');
    auVar5[0xf] = -(cStack_49 == '0');
    if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe | (ushort)(auVar5[0xf] >> 7) << 0xf)
        == 0xffff) {
      return;
    }
  }
  else {
    test_decimal128_from_string__large_cold_1();
LAB_00128d2e:
    test_decimal128_from_string__large_cold_2();
LAB_00128d33:
    test_decimal128_from_string__large_cold_3();
LAB_00128d38:
    test_decimal128_from_string__large_cold_4();
  }
  test_decimal128_from_string__large_cold_5();
  pcStack_d8 = (code *)0x128d67;
  pcStack_78 = &local_18;
  bson_decimal128_from_string("1000000000000000000000000000000000000000",&cStack_88);
  pcStack_d8 = (code *)0x128d78;
  bson_decimal128_from_string("10000000000000000000000000000000000",&cStack_98);
  pcStack_d8 = (code *)0x128d89;
  bson_decimal128_from_string("1000000000000000000000000000000000",&cStack_a8);
  pcStack_d8 = (code *)0x128d9a;
  bson_decimal128_from_string
            ("1000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000"
             ,&cStack_b8);
  uStack_c0 = 0x304c314dc6448d93;
  uStack_c8 = 0x38c15b0a00000000;
  auVar6[0] = -(cStack_88 == '\0');
  auVar6[1] = -(cStack_87 == '\0');
  auVar6[2] = -(cStack_86 == '\0');
  auVar6[3] = -(cStack_85 == '\0');
  auVar6[4] = -(cStack_84 == '\n');
  auVar6[5] = -(cStack_83 == '[');
  auVar6[6] = -(cStack_82 == -0x3f);
  auVar6[7] = -(cStack_81 == '8');
  auVar6[8] = -(cStack_80 == -0x6d);
  auVar6[9] = -(cStack_7f == -0x73);
  auVar6[10] = -(cStack_7e == 'D');
  auVar6[0xb] = -(cStack_7d == -0x3a);
  auVar6[0xc] = -(cStack_7c == 'M');
  auVar6[0xd] = -(cStack_7b == '1');
  auVar6[0xe] = -(cStack_7a == 'L');
  auVar6[0xf] = -(cStack_79 == '0');
  if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe | (ushort)(auVar6[0xf] >> 7) << 0xf) ==
      0xffff) {
    uStack_c0 = 0x3042314dc6448d93;
    uStack_c8 = 0x38c15b0a00000000;
    auVar7[0] = -(cStack_98 == '\0');
    auVar7[1] = -(cStack_97 == '\0');
    auVar7[2] = -(cStack_96 == '\0');
    auVar7[3] = -(cStack_95 == '\0');
    auVar7[4] = -(cStack_94 == '\n');
    auVar7[5] = -(cStack_93 == '[');
    auVar7[6] = -(cStack_92 == -0x3f);
    auVar7[7] = -(cStack_91 == '8');
    auVar7[8] = -(cStack_90 == -0x6d);
    auVar7[9] = -(cStack_8f == -0x73);
    auVar7[10] = -(cStack_8e == 'D');
    auVar7[0xb] = -(cStack_8d == -0x3a);
    auVar7[0xc] = -(cStack_8c == 'M');
    auVar7[0xd] = -(cStack_8b == '1');
    auVar7[0xe] = -(cStack_8a == 'B');
    auVar7[0xf] = -(cStack_89 == '0');
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe | (ushort)(auVar7[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_00128e65;
    uStack_c0 = 0x3040314dc6448d93;
    uStack_c8 = 0x38c15b0a00000000;
    auVar8[0] = -(cStack_a8 == '\0');
    auVar8[1] = -(cStack_a7 == '\0');
    auVar8[2] = -(cStack_a6 == '\0');
    auVar8[3] = -(cStack_a5 == '\0');
    auVar8[4] = -(cStack_a4 == '\n');
    auVar8[5] = -(cStack_a3 == '[');
    auVar8[6] = -(cStack_a2 == -0x3f);
    auVar8[7] = -(cStack_a1 == '8');
    auVar8[8] = -(cStack_a0 == -0x6d);
    auVar8[9] = -(cStack_9f == -0x73);
    auVar8[10] = -(cStack_9e == 'D');
    auVar8[0xb] = -(cStack_9d == -0x3a);
    auVar8[0xc] = -(cStack_9c == 'M');
    auVar8[0xd] = -(cStack_9b == '1');
    auVar8[0xe] = -(cStack_9a == '@');
    auVar8[0xf] = -(cStack_99 == '0');
    if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_00128e6a;
    uStack_c0 = 0x37cc314dc6448d93;
    uStack_c8 = 0x38c15b0a00000000;
    auVar9[0] = -(cStack_b8 == '\0');
    auVar9[1] = -(cStack_b7 == '\0');
    auVar9[2] = -(cStack_b6 == '\0');
    auVar9[3] = -(cStack_b5 == '\0');
    auVar9[4] = -(cStack_b4 == '\n');
    auVar9[5] = -(cStack_b3 == '[');
    auVar9[6] = -(cStack_b2 == -0x3f);
    auVar9[7] = -(cStack_b1 == '8');
    auVar9[8] = -(cStack_b0 == -0x6d);
    auVar9[9] = -(cStack_af == -0x73);
    auVar9[10] = -(cStack_ae == 'D');
    auVar9[0xb] = -(cStack_ad == -0x3a);
    auVar9[0xc] = -(cStack_ac == 'M');
    auVar9[0xd] = -(cStack_ab == '1');
    auVar9[0xe] = -(cStack_aa == -0x34);
    auVar9[0xf] = -(cStack_a9 == '7');
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(auVar9[0xf] >> 7) << 0xf)
        == 0xffff) {
      return;
    }
  }
  else {
    pcStack_d8 = (code *)0x128e65;
    test_decimal128_from_string__exponent_normalization_cold_1();
LAB_00128e65:
    pcStack_d8 = (code *)0x128e6a;
    test_decimal128_from_string__exponent_normalization_cold_2();
LAB_00128e6a:
    pcStack_d8 = (code *)0x128e6f;
    test_decimal128_from_string__exponent_normalization_cold_3();
  }
  pcStack_d8 = test_decimal128_from_string__zeros;
  test_decimal128_from_string__exponent_normalization_cold_4();
  pcStack_d8 = (code *)&cStack_88;
  bson_decimal128_from_string("0",&cStack_e8);
  bson_decimal128_from_string("0e-611",&cStack_f8);
  bson_decimal128_from_string("0e+6000",&cStack_108);
  suite = "-0e-1";
  bson_decimal128_from_string("-0e-1",&cStack_118);
  auVar10[0] = -(cStack_e8 == '\0');
  auVar10[1] = -(cStack_e7 == '\0');
  auVar10[2] = -(cStack_e6 == '\0');
  auVar10[3] = -(cStack_e5 == '\0');
  auVar10[4] = -(cStack_e4 == '\0');
  auVar10[5] = -(cStack_e3 == '\0');
  auVar10[6] = -(cStack_e2 == '\0');
  auVar10[7] = -(cStack_e1 == '\0');
  auVar10[8] = -(cStack_e0 == '\0');
  auVar10[9] = -(cStack_df == '\0');
  auVar10[10] = -(cStack_de == '\0');
  auVar10[0xb] = -(cStack_dd == '\0');
  auVar10[0xc] = -(cStack_dc == '\0');
  auVar10[0xd] = -(cStack_db == '\0');
  auVar10[0xe] = -(cStack_da == '@');
  auVar10[0xf] = -(cStack_d9 == '0');
  if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe | (ushort)(auVar10[0xf] >> 7) << 0xf)
      == 0xffff) {
    auVar11[0] = -(cStack_f8 == '\0');
    auVar11[1] = -(cStack_f7 == '\0');
    auVar11[2] = -(cStack_f6 == '\0');
    auVar11[3] = -(cStack_f5 == '\0');
    auVar11[4] = -(cStack_f4 == '\0');
    auVar11[5] = -(cStack_f3 == '\0');
    auVar11[6] = -(cStack_f2 == '\0');
    auVar11[7] = -(cStack_f1 == '\0');
    auVar11[8] = -(cStack_f0 == '\0');
    auVar11[9] = -(cStack_ef == '\0');
    auVar11[10] = -(cStack_ee == '\0');
    auVar11[0xb] = -(cStack_ed == '\0');
    auVar11[0xc] = -(cStack_ec == '\0');
    auVar11[0xd] = -(cStack_eb == '\0');
    auVar11[0xe] = -(cStack_ea == 'z');
    auVar11[0xf] = -(cStack_e9 == '+');
    if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe | (ushort)(auVar11[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128f91;
    auVar12[0] = -(cStack_108 == '\0');
    auVar12[1] = -(cStack_107 == '\0');
    auVar12[2] = -(cStack_106 == '\0');
    auVar12[3] = -(cStack_105 == '\0');
    auVar12[4] = -(cStack_104 == '\0');
    auVar12[5] = -(cStack_103 == '\0');
    auVar12[6] = -(cStack_102 == '\0');
    auVar12[7] = -(cStack_101 == '\0');
    auVar12[8] = -(cStack_100 == '\0');
    auVar12[9] = -(cStack_ff == '\0');
    auVar12[10] = -(cStack_fe == '\0');
    auVar12[0xb] = -(cStack_fd == '\0');
    auVar12[0xc] = -(cStack_fc == '\0');
    auVar12[0xd] = -(cStack_fb == '\0');
    auVar12[0xe] = -(cStack_fa == ' ');
    auVar12[0xf] = -(cStack_f9 == '_');
    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe | (ushort)(auVar12[0xf] >> 7) << 0xf
                ) == 0xffff) {
      auVar13[0] = -(cStack_118 == '\0');
      auVar13[1] = -(cStack_117 == '\0');
      auVar13[2] = -(cStack_116 == '\0');
      auVar13[3] = -(cStack_115 == '\0');
      auVar13[4] = -(cStack_114 == '\0');
      auVar13[5] = -(cStack_113 == '\0');
      auVar13[6] = -(cStack_112 == '\0');
      auVar13[7] = -(cStack_111 == '\0');
      auVar13[8] = -(cStack_110 == '\0');
      auVar13[9] = -(cStack_10f == '\0');
      auVar13[10] = -(cStack_10e == '\0');
      auVar13[0xb] = -(cStack_10d == '\0');
      auVar13[0xc] = -(cStack_10c == '\0');
      auVar13[0xd] = -(cStack_10b == '\0');
      auVar13[0xe] = -(cStack_10a == '>');
      auVar13[0xf] = -(cStack_109 == -0x50);
      if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar13[0xf] >> 7) << 0xf) == 0xffff) {
        return;
      }
      goto LAB_00128f9b;
    }
  }
  else {
    test_decimal128_from_string__zeros_cold_1();
LAB_00128f91:
    test_decimal128_from_string__zeros_cold_2();
  }
  test_decimal128_from_string__zeros_cold_3();
LAB_00128f9b:
  test_decimal128_from_string__zeros_cold_4();
  TestSuite_Add((TestSuite *)suite,"/bson/error/basic",test_bson_error_basic);
  return;
}

Assistant:

static void
test_decimal128_from_string__large (void)
{
   bson_decimal128_t large;
   bson_decimal128_t all_digits;
   bson_decimal128_t largest;
   bson_decimal128_t tiniest;
   bson_decimal128_t full_house;

   bson_decimal128_from_string ("12345689012345789012345", &large);
   bson_decimal128_from_string ("1234567890123456789012345678901234",
                                &all_digits);
   bson_decimal128_from_string ("9.999999999999999999999999999999999E+6144",
                                &largest);
   bson_decimal128_from_string ("9.999999999999999999999999999999999E-6143",
                                &tiniest);
   bson_decimal128_from_string ("5.192296858534827628530496329220095E+33",
                                &full_house);

   BSON_ASSERT (decimal128_equal (&large, 0x304000000000029d, 0x42da3a76f9e0d979));
   BSON_ASSERT (
      decimal128_equal (&all_digits, 0x30403cde6fff9732, 0xde825cd07e96aff2));
   BSON_ASSERT (decimal128_equal (&largest, 0x5fffed09bead87c0, 0x378d8e63ffffffff));
   BSON_ASSERT (decimal128_equal (&tiniest, 0x0001ed09bead87c0, 0x378d8e63ffffffff));
   BSON_ASSERT (
      decimal128_equal (&full_house, 0x3040ffffffffffff, 0xffffffffffffffff));
}